

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEmitter.cpp
# Opt level: O2

void __thiscall CodeEmitter::resolveReferences(CodeEmitter *this)

{
  iterator iVar1;
  undefined8 extraout_RAX;
  long lVar2;
  CodeEmitter *pCVar3;
  pointer ppVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> p;
  string dataReference;
  allocator local_c1;
  pointer local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_b8;
  key_type local_90;
  undefined1 local_70 [32];
  
  ppVar4 = (this->_dataReferences).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c0 = (this->_dataReferences).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar4 == local_c0) {
      ppVar4 = (this->_references).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_c0 = (this->_references).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (ppVar4 == local_c0) {
          return;
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        pair(&local_b8,ppVar4);
        std::__cxx11::string::string((string *)&local_90,(string *)&local_b8);
        lVar2 = (long)local_b8.second;
        iVar1 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->_labels)._M_h,&local_90);
        if (iVar1.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) break;
        *(short *)((long)(this->_words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar2 * 4 + 2) =
             (short)(*(int *)((long)iVar1.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                    ._M_cur + 0x28) << 2);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b8);
        ppVar4 = ppVar4 + 1;
      }
LAB_0010ce52:
      pCVar3 = (CodeEmitter *)local_70;
      std::__cxx11::string::string((string *)pCVar3,"unresolved reference",&local_c1);
      emitterError(pCVar3,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b8);
      _Unwind_Resume(extraout_RAX);
    }
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::pair(&local_b8,ppVar4);
    std::__cxx11::string::string((string *)&local_90,(string *)&local_b8);
    lVar2 = (long)local_b8.second;
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->_labels)._M_h,&local_90);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      pCVar3 = (CodeEmitter *)&stack0xffffffffffffffb0;
      std::__cxx11::string::string((string *)pCVar3,"unresolved data reference",&local_c1);
      emitterError(pCVar3,(string *)&stack0xffffffffffffffb0);
      goto LAB_0010ce52;
    }
    (this->_words).super__Vector_base<Word,_std::allocator<Word>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar2].data =
         *(int *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                        ._M_cur + 0x28) << 2;
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    ppVar4 = ppVar4 + 1;
  } while( true );
}

Assistant:

void CodeEmitter::resolveReferences() {
    for(auto p : _dataReferences) {
        std::string dataReference = p.first;
        int referenceWordIndex = p.second;
        auto it = _labels.find(dataReference);
        if(it == _labels.end()) {
            emitterError("unresolved data reference");
        } else {
            int labelWordIndex = it->second;
            _words[referenceWordIndex].data = labelWordIndex * 4;
            //std::cout << "resolving data reference: " << reference << ' ' << referenceWordIndex * 4 << ' ' << labelWordIndex * 4 << std::endl;
        }
    }
    for(auto p : _references) {
        std::string reference = p.first;
        int referenceWordIndex = p.second;
        auto it = _labels.find(reference);
        if(it == _labels.end()) {
            emitterError("unresolved reference");
        } else {
            int labelWordIndex = it->second;
            _words[referenceWordIndex].instruction.adr = labelWordIndex * 4;
            //std::cout << "resolving reference: " << reference << ' ' << referenceWordIndex * 4 << ' ' << labelWordIndex * 4 << std::endl;
        }
    }
}